

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O1

int __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::countWithinDistance
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          model_t *model_coefficients,double threshold)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  bool bVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  int iVar16;
  undefined1 auVar17 [64];
  vector<double,_std::allocator<double>_> dist;
  vector<double,_std::allocator<double>_> local_48;
  double local_28;
  undefined1 auVar11 [32];
  undefined1 auVar10 [32];
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  peVar3 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_28 = threshold;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_48,
             (long)(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(peVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  (*this->_vptr_SampleConsensusProblem[8])(this,model_coefficients,&local_48);
  if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    iVar16 = 0;
  }
  else {
    lVar7 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    auVar12 = vpbroadcastq_avx512f();
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_28;
    auVar13 = vbroadcastsd_avx512f(auVar2);
    uVar8 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar17 = auVar15;
      auVar15 = vpbroadcastq_avx512f();
      auVar15 = vporq_avx512f(auVar15,auVar14);
      uVar6 = vpcmpuq_avx512f(auVar15,auVar12,2);
      pdVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      auVar15._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * (long)pdVar1[1];
      auVar15._0_8_ = (ulong)((byte)uVar6 & 1) * (long)*pdVar1;
      auVar15._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * (long)pdVar1[2];
      auVar15._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * (long)pdVar1[3];
      auVar15._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * (long)pdVar1[4];
      auVar15._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * (long)pdVar1[5];
      auVar15._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * (long)pdVar1[6];
      auVar15._56_8_ = (uVar6 >> 7) * (long)pdVar1[7];
      uVar5 = vcmppd_avx512f(auVar15,auVar13,1);
      auVar10 = vpmovm2d_avx512vl(uVar5);
      auVar10 = vpsubd_avx2(auVar17._0_32_,auVar10);
      uVar8 = uVar8 + 8;
      auVar15 = ZEXT3264(auVar10);
    } while ((lVar7 + (ulong)(lVar7 == 0) + 7 & 0xfffffffffffffff8) != uVar8);
    auVar10 = vmovdqa32_avx512vl(auVar10);
    bVar4 = (bool)((byte)uVar6 & 1);
    auVar9._0_4_ = (uint)bVar4 * auVar10._0_4_ | (uint)!bVar4 * auVar17._0_4_;
    bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar9._4_4_ = (uint)bVar4 * auVar10._4_4_ | (uint)!bVar4 * auVar17._4_4_;
    bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar9._8_4_ = (uint)bVar4 * auVar10._8_4_ | (uint)!bVar4 * auVar17._8_4_;
    bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar9._12_4_ = (uint)bVar4 * auVar10._12_4_ | (uint)!bVar4 * auVar17._12_4_;
    bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar11._16_4_ = (uint)bVar4 * auVar10._16_4_ | (uint)!bVar4 * auVar17._16_4_;
    auVar11._0_16_ = auVar9;
    bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar11._20_4_ = (uint)bVar4 * auVar10._20_4_ | (uint)!bVar4 * auVar17._20_4_;
    bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar11._24_4_ = (uint)bVar4 * auVar10._24_4_ | (uint)!bVar4 * auVar17._24_4_;
    bVar4 = SUB81(uVar6 >> 7,0);
    auVar11._28_4_ = (uint)bVar4 * auVar10._28_4_ | (uint)!bVar4 * auVar17._28_4_;
    auVar2 = vphaddd_avx(auVar11._16_16_,auVar9);
    auVar2 = vphaddd_avx(auVar2,auVar2);
    auVar2 = vphaddd_avx(auVar2,auVar2);
    iVar16 = auVar2._0_4_;
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar16;
}

Assistant:

int
opengv::sac::SampleConsensusProblem<M>::countWithinDistance(
    const model_t & model_coefficients, const double threshold)
{
  std::vector<double> dist;
  dist.reserve(indices_->size());
  getDistancesToModel( model_coefficients, dist );

  int count = 0;
  for( size_t i = 0; i < dist.size(); ++i )
  {
    if( dist[i] < threshold )
      ++count;
  }

  return count;
}